

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::AddSource(cmGeneratorTarget *this,string *src)

{
  PositionType *__return_storage_ptr__;
  cmCompiledGeneratorExpression *this_00;
  TargetPropertyEntry *this_01;
  auto_ptr<cmCompiledGeneratorExpression> local_d0;
  TargetPropertyEntry *local_c8;
  undefined1 local_c0 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_98 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  cmTarget::AddSource(this->Target,src);
  __return_storage_ptr__ = &ge.Backtrace.Snapshot.Position.Position;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)__return_storage_ptr__,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_98,(cmListFileBacktrace *)__return_storage_ptr__);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c0,(string *)local_98);
  local_c0._8_8_ = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_c0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_c0 + 0x10),
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_c0._8_8_);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_c0);
  this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                      ((auto_ptr<cmCompiledGeneratorExpression> *)(local_c0 + 0x10));
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_00,true);
  this_01 = (TargetPropertyEntry *)operator_new(0x10);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_d0,(auto_ptr<cmCompiledGeneratorExpression> *)(local_c0 + 0x10));
  TargetPropertyEntry::TargetPropertyEntry(this_01,&local_d0,&TargetPropertyEntry::NoLinkImplItem);
  local_c8 = this_01;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::push_back(&this->SourceEntries,&local_c8);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_d0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::clear(&this->SourceFilesMap);
  this->LinkImplementationLanguageIsContextDependent = true;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_c0 + 0x10));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_98);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)&ge.Backtrace.Snapshot.Position.Position);
  return;
}

Assistant:

void cmGeneratorTarget::AddSource(const std::string& src)
{
  this->Target->AddSource(src);
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(
                        new TargetPropertyEntry(cge));
  this->SourceFilesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}